

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall TestMaterial::TestAnimation(TestMaterial *this)

{
  Scalar SVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  double *pdVar5;
  S_Object *pSVar6;
  Scalar SVar7;
  reference pvVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Scalar distance;
  Point3 p2;
  Point3 p1;
  uint j_1;
  uint k;
  double local_130;
  double local_128;
  Vector3T<double,_false> local_120;
  Vector3T<double,_false> local_108;
  Vector3T<double,_false> local_f0;
  double local_d8;
  Scalar js;
  Scalar is;
  size_t j;
  long i_1;
  clock_t end;
  clock_t begin;
  ulong local_98;
  size_t i;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  oldPos;
  double angle;
  double local_68;
  double local_60;
  undefined1 local_58 [8];
  Vector3 axe;
  double local_38;
  double local_30;
  undefined1 auStack_28 [8];
  Vector3 position;
  TestMaterial *this_local;
  
  position.m_z = (double)this;
  poVar3 = std::operator<<((ostream *)&std::cout,"TestAnimation");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_30 = 3.0;
  local_38 = 3.0;
  axe.m_z = 3.0;
  CD_Matrix::Vector3T<double,_false>::Vector3T
            ((Vector3T<double,_false> *)auStack_28,&local_30,&local_38,&axe.m_z);
  local_60 = 0.0;
  local_68 = 0.0;
  angle = 1.0;
  CD_Matrix::Vector3T<double,_false>::Vector3T
            ((Vector3T<double,_false> *)local_58,&local_60,&local_68,&angle);
  oldPos.
  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
          *)&i);
  local_98 = 0;
  while( true ) {
    uVar10 = local_98;
    sVar4 = sch::CD_Scene::size(&this->sObj);
    if (sVar4 <= uVar10) break;
    uVar10 = local_98 * 7;
    pdVar5 = CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)auStack_28,0)
    ;
    *pdVar5 = ((double)((int)uVar10 + (int)(uVar10 / 5) * -5) + -2.0) * 0.2;
    uVar10 = local_98 * 5;
    pdVar5 = CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)auStack_28,1)
    ;
    *pdVar5 = ((double)((int)uVar10 + (int)(uVar10 / 6) * -6) + -3.0) * 0.8333333333333334 * 0.2;
    uVar10 = local_98 * 5;
    pdVar5 = CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)auStack_28,2)
    ;
    *pdVar5 = ((double)((int)uVar10 + (int)(uVar10 / 7) * -7) + -3.0) * 0.7142857142857143 * 0.2;
    std::
    vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
    ::push_back((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                 *)&i,(value_type *)auStack_28);
    pSVar6 = sch::CD_Scene::operator[](&this->sObj,local_98);
    sch::S_Object::setOrientation
              ((double *)pSVar6,
               (Vector3T *)
               &oldPos.
                super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar6 = sch::CD_Scene::operator[](&this->sObj,local_98);
    sch::S_Object::setPosition(pSVar6);
    local_98 = local_98 + 1;
  }
  sch::CD_Scene::sceneProximityQuery();
  display();
  end = clock();
  for (j = 0; (long)j < 10000; j = j + 1) {
    is = 0.0;
    while( true ) {
      SVar1 = is;
      SVar7 = (Scalar)sch::CD_Scene::size(&this->sObj);
      if ((ulong)SVar7 <= (ulong)SVar1) break;
      pvVar8 = std::
               vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
               ::operator[]((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                             *)&i,(size_type)is);
      position.m_y = pvVar8->m_z;
      auStack_28 = (undefined1  [8])pvVar8->m_x;
      position.m_x = pvVar8->m_y;
      js = (Scalar)(long)j;
      auVar13._8_4_ = (int)((ulong)is >> 0x20);
      auVar13._0_8_ = is;
      auVar13._12_4_ = 0x45300000;
      local_d8 = (auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,SUB84(is,0)) - 4503599627370496.0);
      dVar11 = local_d8 + 42.0;
      dVar12 = sin(js * 0.0006000000000000001);
      dVar11 = sin(dVar11 * dVar12);
      pdVar5 = CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)local_58,0)
      ;
      *pdVar5 = dVar11;
      dVar11 = -43.0 - local_d8;
      dVar12 = sin(js * 0.0006000000000000001);
      dVar11 = sin(dVar11 * dVar12);
      pdVar5 = CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)local_58,1)
      ;
      *pdVar5 = dVar11;
      dVar11 = local_d8 + 83.0;
      dVar12 = sin(js * 0.00030000000000000003);
      dVar11 = cos(dVar11 * dVar12);
      pdVar5 = CD_Matrix::Vector3T<double,_false>::operator[]((Vector3T<double,_false> *)local_58,2)
      ;
      *pdVar5 = dVar11;
      dVar11 = 97.0 - local_d8;
      dVar12 = sin(js * 0.0015);
      dVar12 = sin(dVar12 * 0.2);
      dVar11 = sin(dVar11 * dVar12);
      oldPos.
      super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(dVar11 * 4.0);
      pSVar6 = sch::CD_Scene::operator[](&this->sObj,(size_t)is);
      sch::S_Object::setOrientation
                ((double *)pSVar6,
                 (Vector3T *)
                 &oldPos.
                  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pSVar6 = sch::CD_Scene::operator[](&this->sObj,(size_t)is);
      uVar10 = (ulong)is / 3;
      iVar2 = SUB84(is,0);
      dVar11 = local_d8 + local_d8;
      dVar12 = sin(js * 0.0006000000000000001);
      local_128 = sin(((double)(iVar2 + (int)uVar10 * -3 + 1) * 20.0 + dVar11) * dVar12);
      lVar9 = (long)is * 2 + (ulong)(SUB84(is,0) & 1) * -0x8c + 0xd3;
      auVar14._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar14._0_8_ = lVar9;
      auVar14._12_4_ = 0x45300000;
      dVar11 = sin(js * 0.00045);
      local_130 = sin(((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) * dVar11);
      lVar9 = (long)is * 0x1c + ((ulong)((long)is * 5) / 7) * -0x23 + 0x14;
      auVar15._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar15._0_8_ = lVar9;
      auVar15._12_4_ = 0x45300000;
      dVar11 = sin(js * 0.0006000000000000001);
      _j_1 = sin(((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) * dVar11);
      CD_Matrix::Vector3T<double,_false>::Vector3T(&local_120,&local_128,&local_130,(double *)&j_1);
      CD_Matrix::Vector3T<double,_false>::operator*(&local_108,&local_120,&AnimationScale);
      CD_Matrix::Vector3T<double,false>::operator+
                (&local_f0,(Vector3T<double,false> *)auStack_28,&local_108);
      sch::S_Object::setPosition(pSVar6);
      is = (Scalar)((long)is + 1);
    }
    sch::CD_Scene::sceneProximityQuery();
    p1.m_z._4_4_ = 0;
    while( true ) {
      sVar4 = sch::CD_Scene::size(&this->sObj);
      if (sVar4 <= p1.m_z._4_4_) break;
      for (p1.m_z._0_4_ = 0; p1.m_z._0_4_ < p1.m_z._4_4_; p1.m_z._0_4_ = p1.m_z._0_4_ + 1) {
        CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)&p2.m_z);
        CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)&distance);
        sch::CD_Scene::getWitnessPoints
                  (&this->sObj,p1.m_z._4_4_,p1.m_z._0_4_,(Point3 *)&p2.m_z,(Point3 *)&distance);
      }
      p1.m_z._4_4_ = p1.m_z._4_4_ + 1;
    }
    display();
  }
  i_1 = clock();
  poVar3 = std::operator<<((ostream *)&std::cout,"  computation time: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)(i_1 - end) / 1000000.0);
  poVar3 = std::operator<<(poVar3," : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,((double)(i_1 - end) / 1000000.0) / 10000.0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  ~vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
           *)&i);
  return;
}

Assistant:

void TestMaterial::TestAnimation()
{
  std::cout << "TestAnimation" << std::endl;
  Vector3 position(3, 3, 3);
  Vector3 axe(0, 0, 1);
  double angle(0);

  std::vector<Vector3> oldPos;

  for (size_t i=0; i<sObj.size(); i++)
  {
    position[0] =(Scalar(7*i%5)-2.)*DispersionScale;
    position[1] =((Scalar(5*i%6)-3.)*(5.0/6.))*DispersionScale;
    position[2] =((Scalar(5*i%7)-3.)*(5.0/7.))*DispersionScale;

    oldPos.push_back(position);

    sObj[i]->setOrientation(angle,axe);
    sObj[i]->setPosition(position);
  }

#ifdef DO_TEST
  sObj.sceneProximityQuery();
#endif

  display();

  clock_t begin, end;



# ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_animationtest_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
# endif


#ifdef IRREGULARITIES_COUNTERS
  Scalar previousDistance=2e90;
  int irrCpt=0;
#endif

#ifdef COLLISION_COUNTERS
  int collCpt=0;
  int totalCpt=0;
#endif

  begin=clock();

  for (long i=0; i<AnimationEnd; i++)
  {
    for (size_t j=0; j<sObj.size(); j++)
    {
      position=oldPos[j];

      Scalar is= Scalar(i), js = Scalar(j);


      axe[0] =  sin((42+js)*sin(0.2*AnimationSpeed*is));
      axe[1] =  sin((-43-js)*sin(0.2*AnimationSpeed*is));
      axe[2] =  cos((83+js)*sin(0.1*AnimationSpeed*is));

      angle=4*sin((97-js)*sin(0.2*sin(0.5*AnimationSpeed*is)));


      sObj[j]->setOrientation(angle,axe);

      sObj[j]->setPosition( position + Vector3(sin((20*Scalar(j%3+1)+2*js)*sin(0.2*AnimationSpeed*is)),
                            sin(Scalar(71-140*(j%2-1)+2*j)*sin(0.15*AnimationSpeed*is)),
                            sin(Scalar(20+((j*5)%7)*5+3*j)*sin(0.2*AnimationSpeed*is)))*AnimationScale);
    }



#ifdef DO_TEST
    sObj.sceneProximityQuery();

    for (unsigned k=0; k<sObj.size(); k++)
    {
      for (unsigned j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
# ifndef OUTPUT_FILE        
        (void) distance; ///prevent warning about unused variable
# else
        outfile<<p1<<p2<<distance<<std::endl;
# endif
      }
    }

# ifdef IRREGULARITIES_COUNTERS
    Point3 p1,p2;
    Scalar distance=sObj.getWitnessPoints(0,1,p1,p2);
    Scalar distance2=(p1-p2).normsquared();
    if (previousDistance!=2e90)
    {
      if (fabs(fabs(distance)-distance2)>(0.001*(fabs(distance)+distance2)/2))
      {
        irrCpt++;
        std::cout<<"Witness Points Irregularity : "<<i<<' '<<distance<<' '<<distance2<<std::endl;
      }
      if (fabs(distance-previousDistance)>0.1)
      {
        irrCpt++;
        std::cout<<"Coherence Irregularity : "<<i;
      }
    }
    previousDistance=distance;
# endif // IRREGULARITIES_COUNTERS




# ifdef COLLISION_COUNTERS
    for (int k=0; k<sObj.size(); k++)
    {
      for (int j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
        if (distance<0)
          collCpt++;
        totalCpt++;
      }
    }
# endif

#endif


#ifdef TEST_HOLD
    std::cout<<i<<std::endl;
    system("pause");
#endif


#ifdef DISPLAY_DISTANCE
    for (int k=0; k<sObj.size(); k++)
    {
      for (int j=0; j<k; j++)
      {
        Point3 p1,p2;
        Scalar distance=sObj.getWitnessPoints(k,j,p1,p2);
        std::cout<<distance<<std::endl;
      }
    }
#endif

    display();
  }

  end=clock();

  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) << " : " << ((double)(end - begin) / CLOCKS_PER_SEC)/(AnimationEnd) << std::endl;

#ifdef IRREGULARITIES_COUNTERS
  std::cout<<"Irregularities : "<<irrCpt<<std::endl;
  outfile  <<"Irregularities : "<<irrCpt<<std::endl;
#endif


#ifdef COLLISION_COUNTERS
  std::cout << "Collisions : "<<collCpt<< " Total pairs checked : "<<totalCpt<<std::endl;
  outfile   << "Collisions : "<<collCpt<< " Total pairs checked : "<<totalCpt<<std::endl;
#endif

#ifdef OUTPUT_FILE
  outfile.close();
#endif

}